

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

int __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::init
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          EVP_PKEY_CTX *ctx)

{
  int iVar1;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar2;
  undefined4 extraout_var;
  int in_ECX;
  uint in_EDX;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  undefined8 local_30;
  int *piVar3;
  
  if (in_ECX == 0) {
    pDVar2 = (DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              *)operator_new(0x228);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)ctx,*(long *)(ctx + 8) + *(long *)ctx);
    DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
    ::DynamicFileManager(pDVar2,&local_70,in_EDX);
    this->file = pDVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      pDVar2 = this->file;
    }
    if ((pDVar2->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        ).is_newfile != true) {
      local_30 = 0x648;
      iVar1 = (*(pDVar2->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(pDVar2);
      piVar3 = (int *)CONCAT44(extraout_var,iVar1);
      this->root = *(locType *)(piVar3 + 200);
      this->depth = *piVar3;
      iVar1 = piVar3[1];
      goto LAB_00114419;
    }
    (*(pDVar2->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[1])(pDVar2);
  }
  else {
    pDVar2 = this->file;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,*(long *)ctx,*(long *)(ctx + 8) + *(long *)ctx);
    (**(pDVar2->
       super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
       )._vptr_FileManager_Base)(pDVar2,(string *)local_50,(ulong)in_EDX,1);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  this->root = -1;
  this->depth = 0;
  iVar1 = 0;
LAB_00114419:
  this->siz = iVar1;
  return iVar1;
}

Assistant:

void init(std::string str , unsigned int cache_size , bool is_reset = false)
        {
            if (is_reset) {
                file->init(str, cache_size , true);
                root = -1,depth = 0,siz=0;
            } else {
                file = new DynamicFileManager<node>(str , cache_size);
                if (file->is_newfile)
		{
                	file->newspace();
			root = - 1 , depth = 0 , siz = 0;
		}
                else
                    getfromcache();
            }
        }